

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUVStreambuf.cxx
# Opt level: O0

int testUVStreambuf(int argc,char **argv)

{
  bool bVar1;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    std::operator<<((ostream *)&std::cout,"Invalid arguments.\n");
    argv_local._4_4_ = -1;
  }
  else {
    bVar1 = testUVStreambufRead(writeDataToStreamPipe,argv[1]);
    if (bVar1) {
      bVar1 = testUVStreambufRead(writeDataToStreamProcess,argv[1]);
      if (bVar1) {
        argv_local._4_4_ = 0;
      }
      else {
        std::operator<<((ostream *)&std::cout,
                        "While executing testUVStreambufRead() with process.\n");
        argv_local._4_4_ = -1;
      }
    }
    else {
      std::operator<<((ostream *)&std::cout,"While executing testUVStreambufRead() with pipe.\n");
      argv_local._4_4_ = -1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int testUVStreambuf(int argc, char** const argv)
{
  if (argc < 2) {
    std::cout << "Invalid arguments.\n";
    return -1;
  }

  if (!testUVStreambufRead(writeDataToStreamPipe, argv[1])) {
    std::cout << "While executing testUVStreambufRead() with pipe.\n";
    return -1;
  }

  if (!testUVStreambufRead(writeDataToStreamProcess, argv[1])) {
    std::cout << "While executing testUVStreambufRead() with process.\n";
    return -1;
  }

  return 0;
}